

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::WaitForkStatementSyntax::setChild
          (WaitForkStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar2;
  logic_error *this_00;
  Token TVar3;
  NamedLabelSyntax *local_148;
  string local_120;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  WaitForkStatementSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_148 = (NamedLabelSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_148 = SyntaxNode::as<slang::syntax::NamedLabelSyntax>(pSVar1);
    }
    (this->super_StatementSyntax).label = local_148;
    break;
  case 1:
    pSVar1 = TokenOrSyntax::node(&child);
    pSVar2 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar1);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_StatementSyntax).attributes,pSVar2);
    break;
  case 2:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar3._0_8_;
    (this->wait).kind = (undefined2)local_28;
    (this->wait).field_0x2 = local_28._2_1_;
    (this->wait).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->wait).rawLen = local_28._4_4_;
    local_20 = TVar3.info;
    (this->wait).info = local_20;
    break;
  case 3:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar3._0_8_;
    (this->fork).kind = (undefined2)local_38;
    (this->fork).field_0x2 = local_38._2_1_;
    (this->fork).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->fork).rawLen = local_38._4_4_;
    local_30 = TVar3.info;
    (this->fork).info = local_30;
    break;
  case 4:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar3._0_8_;
    (this->semi).kind = (undefined2)local_48;
    (this->semi).field_0x2 = local_48._2_1_;
    (this->semi).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->semi).rawLen = local_48._4_4_;
    local_40 = TVar3.info;
    (this->semi).info = local_40;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_e9);
    std::operator+(&local_c8,&local_e8,":");
    std::__cxx11::to_string(&local_120,0x3636);
    std::operator+(&local_a8,&local_c8,&local_120);
    std::operator+(&local_88,&local_a8,": ");
    std::operator+(&local_68,&local_88,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_68);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void WaitForkStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: wait = child.token(); return;
        case 3: fork = child.token(); return;
        case 4: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}